

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::SetPackageName(CommandLineArguments *this,int ac,char **av,int *i)

{
  SimpleString *this_00;
  undefined8 in_RCX;
  int ac_00;
  CommandLineArguments *in_RDX;
  SimpleString packageName;
  SimpleString *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  SimpleString *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  char **in_stack_ffffffffffffffd8;
  
  ac_00 = (int)((ulong)in_RCX >> 0x20);
  SimpleString::SimpleString(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  getParameterField(in_RDX,ac_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffc8);
  SimpleString::~SimpleString((SimpleString *)0x21d9b1);
  this_00 = (SimpleString *)SimpleString::size((SimpleString *)0x21d9bb);
  if (this_00 != (SimpleString *)0x0) {
    SimpleString::operator=(this_00,in_stack_ffffffffffffff88);
  }
  SimpleString::~SimpleString((SimpleString *)0x21da32);
  return;
}

Assistant:

void CommandLineArguments::SetPackageName(int ac, const char** av, int& i)
{
    SimpleString packageName = getParameterField(ac, av, i, "-k");
    if (packageName.size() == 0) return;

    packageName_ = packageName;
}